

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManCnfAddStatic(sat_solver2 *pSat,Vec_Int_t *vCnf0,Vec_Int_t *vCnf1,int *Lits,int iLitOut,
                        int ProofId)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  Vec_Int_t *pVVar8;
  bool bVar9;
  int ClaLits [6];
  uint local_48 [6];
  
  uVar2 = 0;
  do {
    pVVar8 = vCnf1;
    if (uVar2 == 0) {
      pVVar8 = vCnf0;
    }
    if (0 < pVVar8->nSize) {
      lVar5 = 0;
      do {
        iVar1 = pVVar8->pArray[lVar5];
        iVar4 = 1;
        lVar3 = 0;
        do {
          local_48[0] = uVar2 ^ iLitOut;
          switch(iVar1 >> ((byte)lVar3 & 0x1f) & 3) {
          case 0:
            goto switchD_005f4395_caseD_0;
          case 1:
            uVar6 = *(uint *)((long)Lits + lVar3 * 2);
            break;
          case 2:
            uVar6 = *(uint *)((long)Lits + lVar3 * 2) ^ 1;
            break;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x2c5,
                          "void Ga2_ManCnfAddStatic(sat_solver2 *, Vec_Int_t *, Vec_Int_t *, int *, int, int)"
                         );
          }
          lVar7 = (long)iVar4;
          iVar4 = iVar4 + 1;
          local_48[lVar7] = uVar6;
switchD_005f4395_caseD_0:
          lVar3 = lVar3 + 2;
        } while (lVar3 != 10);
        sat_solver2_addclause(pSat,(lit *)local_48,(lit *)(local_48 + iVar4),ProofId);
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar8->nSize);
    }
    bVar9 = uVar2 != 0;
    uVar2 = uVar2 + 1;
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void Ga2_ManCnfAddStatic( sat_solver2 * pSat, Vec_Int_t * vCnf0, Vec_Int_t * vCnf1, int Lits[], int iLitOut, int ProofId )
{
    Vec_Int_t * vCnf;
    int i, k, b, Cube, Literal, nClaLits, ClaLits[6];
    for ( i = 0; i < 2; i++ )
    {
        vCnf = i ? vCnf1 : vCnf0;
        Vec_IntForEachEntry( vCnf, Cube, k )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            for ( b = 0; b < 5; b++ )
            {
                Literal = 3 & (Cube >> (b << 1));
                if ( Literal == 1 ) // value 0 --> add positive literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Literal == 2 ) // value 1 --> add negative literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                else if ( Literal != 0 )
                    assert( 0 );
            }
            sat_solver2_addclause( pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}